

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitemanimation.cpp
# Opt level: O0

void __thiscall
QGraphicsItemAnimationPrivate::~QGraphicsItemAnimationPrivate(QGraphicsItemAnimationPrivate *this)

{
  QList<QGraphicsItemAnimationPrivate::Pair>::~QList
            ((QList<QGraphicsItemAnimationPrivate::Pair> *)0xa62e43);
  QList<QGraphicsItemAnimationPrivate::Pair>::~QList
            ((QList<QGraphicsItemAnimationPrivate::Pair> *)0xa62e54);
  QList<QGraphicsItemAnimationPrivate::Pair>::~QList
            ((QList<QGraphicsItemAnimationPrivate::Pair> *)0xa62e65);
  QList<QGraphicsItemAnimationPrivate::Pair>::~QList
            ((QList<QGraphicsItemAnimationPrivate::Pair> *)0xa62e76);
  QList<QGraphicsItemAnimationPrivate::Pair>::~QList
            ((QList<QGraphicsItemAnimationPrivate::Pair> *)0xa62e87);
  QList<QGraphicsItemAnimationPrivate::Pair>::~QList
            ((QList<QGraphicsItemAnimationPrivate::Pair> *)0xa62e98);
  QList<QGraphicsItemAnimationPrivate::Pair>::~QList
            ((QList<QGraphicsItemAnimationPrivate::Pair> *)0xa62ea9);
  QList<QGraphicsItemAnimationPrivate::Pair>::~QList
            ((QList<QGraphicsItemAnimationPrivate::Pair> *)0xa62eba);
  QList<QGraphicsItemAnimationPrivate::Pair>::~QList
            ((QList<QGraphicsItemAnimationPrivate::Pair> *)0xa62ecb);
  QPointer<QTimeLine>::~QPointer((QPointer<QTimeLine> *)0xa62ed9);
  return;
}

Assistant:

inline QGraphicsItemAnimationPrivate()
        : q(nullptr), timeLine(nullptr), item(nullptr), step(0)
    { }